

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O2

void __thiscall PcodeGenerator::InlineReplace(PcodeGenerator *this)

{
  vector<Pcode,_std::allocator<Pcode>_> *this_00;
  bool bVar1;
  __type _Var2;
  FunctionTable *this_01;
  iterator __position;
  const_iterator __position_00;
  pointer pPVar3;
  int argument_number;
  string func_name;
  string top_label;
  string bottom_label;
  string num3;
  int local_bc;
  iterator local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = handle_func_table;
  handle_func_table->m_current_term_ptr = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_pcode_queue;
LAB_0013bf14:
  bVar1 = FunctionTable::GetFuncLabel(this_01,&local_90,&local_70);
  if (!bVar1) {
    for (__position_00._M_current =
              (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
              super__Vector_impl_data._M_start;
        __position_00._M_current !=
        (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
        super__Vector_impl_data._M_finish; __position_00._M_current = __position_00._M_current + 1)
    {
      if ((__position_00._M_current)->m_op == NOP) {
        __position_00._M_current =
             (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase(this_00,__position_00);
      }
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  bVar1 = CanInline(this,&local_90,&local_70);
  if (bVar1) {
    fprintf(_stdout,"can inline label:%s---%s\n",local_90._M_dataplus._M_p,local_70._M_dataplus._M_p
           );
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    FunctionTable::GetCurrentTermName(handle_func_table,&local_b0);
    FunctionTable::GetCurrentTermArgumentNumber(handle_func_table,&local_bc);
    for (pPVar3 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                  super__Vector_impl_data._M_start; local_b8._M_current = pPVar3,
        pPVar3 != (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                  super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
      if (pPVar3->m_op == CALL) {
        std::__cxx11::string::string((string *)&local_50,(string *)&pPVar3->m_num3);
        _Var2 = std::operator==(&local_50,&local_b0);
        if (_Var2) {
          CallReplace(this,&local_b8,&local_90,&local_70,local_bc);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    for (__position._M_current =
              (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
              super__Vector_impl_data._M_start; __position._M_current != pPVar3;
        __position._M_current = __position._M_current + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)&(__position._M_current)->m_num1);
      if ((__position._M_current)->m_op == LABEL) {
        _Var2 = std::operator==(&local_50,&local_90);
        if (_Var2) goto LAB_0013c041;
      }
      std::__cxx11::string::~string((string *)&local_50);
      pPVar3 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    goto LAB_0013c067;
  }
  goto LAB_0013c071;
LAB_0013c041:
  do {
    __position = std::vector<Pcode,_std::allocator<Pcode>_>::erase(this_00,__position._M_current);
  } while ((__position._M_current)->m_op != FUNC_BOTTOM);
  std::vector<Pcode,_std::allocator<Pcode>_>::erase(this_00,(const_iterator)__position._M_current);
  std::__cxx11::string::~string((string *)&local_50);
LAB_0013c067:
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0013c071:
  this_01 = handle_func_table;
  handle_func_table->m_current_term_ptr = handle_func_table->m_current_term_ptr + 1;
  goto LAB_0013bf14;
}

Assistant:

void PcodeGenerator::InlineReplace() {
    handle_func_table->ZeroCurrentTermPtr();
    string top_label;
    string bottom_label;
    while (handle_func_table->GetFuncLabel(top_label, bottom_label)) {
        if (CanInline(top_label, bottom_label)){
            fprintf(stdout, "can inline label:%s---%s\n", top_label.c_str(), bottom_label.c_str());
            string func_name;
            handle_func_table->GetCurrentTermName(func_name);
            int argument_number;
            handle_func_table->GetCurrentTermArgumentNumber(argument_number);
            // replace func code
            for (auto iter=m_pcode_queue.begin(); iter!=m_pcode_queue.end(); ++iter) {
                PcodeType op = iter->GetOP();
                if (op == CALL) {
                    string num3 = iter->GetNum3();
                    if (num3 == func_name) {
                        CallReplace(iter, top_label, bottom_label, argument_number);
                    }
                }
            }
            // delete origin func
            for (auto iter=m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
                string num1 = iter->GetNum1();
                PcodeType op = iter->GetOP();
                if (op == LABEL && num1 == top_label) {
                    do {
                        //fprintf(stdout, "erase---%s\n", iter->GetNum1().c_str());
                        iter = m_pcode_queue.erase(iter);
                        op = iter->GetOP();
                        //num1 = iter->GetNum1();
                    //} while (op != LABEL || num1 != bottom_label); 
                    } while (op != FUNC_BOTTOM);
                    iter = m_pcode_queue.erase(iter);
                    break;
                } else {
                    iter++;
                }
            }
        }
        handle_func_table->NextTerm();
    }
    for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end(); ++iter) {
        if (iter->GetOP() == NOP) {
            iter = m_pcode_queue.erase(iter);
        }
    }
}